

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableRead.cpp
# Opt level: O0

VariableRead * __thiscall ninx::parser::element::VariableRead::clone_impl(VariableRead *this)

{
  VariableRead *this_00;
  VariableRead *this_local;
  
  this_00 = (VariableRead *)operator_new(0x40);
  VariableRead(this_00,&this->name,0);
  return this_00;
}

Assistant:

ninx::parser::element::VariableRead * ninx::parser::element::VariableRead::clone_impl() {
    return new VariableRead(this->name, 0);
}